

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReportSection.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Element *pEVar1;
  QBrush *pQVar2;
  int i;
  int iVar3;
  int iVar4;
  AlignmentFlag AVar5;
  int iVar6;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QLatin1String latin1_01;
  QLatin1String latin1_02;
  PreviewDialog preview;
  TableElement largeTableElement;
  QString tocText;
  QStringList tocList;
  Report report;
  QArrayDataPointer<char16_t> local_b8;
  QList<QTextOption::Tab> tabs;
  int argc_local;
  TextElement tocElement;
  TextElement pageCountElement;
  QApplication app;
  
  argc_local = argc;
  QApplication::QApplication(&app,&argc_local,argv,0x60204);
  KDReports::Report::Report(&report,(QObject *)0x0);
  QString::QString((QString *)&preview,"Arial");
  QFont::QFont((QFont *)&largeTableElement,(QString *)&preview,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QFont::~QFont((QFont *)&largeTableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::Report::setFirstPageNumber((int)&report);
  pEVar1 = (Element *)KDReports::Report::header(&report,1);
  QString::QString((QString *)&largeTableElement,
                   "This is a test for generating one section of a larger report.");
  KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&largeTableElement);
  AVar5 = (AlignmentFlag)&preview;
  KDReports::Header::addElement(pEVar1,AVar5);
  KDReports::TextElement::~TextElement((TextElement *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&largeTableElement)
  ;
  pEVar1 = (Element *)KDReports::Report::footer(&report,6);
  QString::QString((QString *)&largeTableElement,"We are generating pages 100-109 out of 500.");
  KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&largeTableElement);
  KDReports::Header::addElement(pEVar1,AVar5);
  KDReports::TextElement::~TextElement((TextElement *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&largeTableElement)
  ;
  QString::QString((QString *)&largeTableElement,"Page");
  KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&largeTableElement);
  KDReports::Header::addElement(pEVar1,AVar5);
  KDReports::TextElement::~TextElement((TextElement *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&largeTableElement)
  ;
  QString::QString((QString *)&largeTableElement," ");
  KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&largeTableElement);
  KDReports::Header::addInlineElement(pEVar1);
  KDReports::TextElement::~TextElement((TextElement *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&largeTableElement)
  ;
  KDReports::Header::addVariable((VariableType)pEVar1);
  QString::QString((QString *)&largeTableElement," / ");
  KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&largeTableElement);
  KDReports::Header::addInlineElement(pEVar1);
  KDReports::TextElement::~TextElement((TextElement *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&largeTableElement)
  ;
  _preview = 0;
  KDReports::TextElement::TextElement(&pageCountElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  latin1.m_data = "id_page_count";
  latin1.m_size = 0xd;
  QString::QString((QString *)&preview,latin1);
  KDReports::TextElement::setId((QString *)&pageCountElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::Header::addInlineElement(pEVar1);
  tabs.d.d = (Data *)0x0;
  tabs.d.ptr = (Tab *)0x0;
  tabs.d.size = 0;
  _preview = KDReports::Report::rightAlignedTab();
  QList<QTextOption::Tab>::emplaceBack<QTextOption::Tab>(&tabs,(Tab *)&preview);
  KDReports::Report::setTabPositions((QList *)&report);
  QString::QString((QString *)&preview,"<Table of Contents will go here>");
  KDReports::TextElement::TextElement(&tocElement,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  latin1_00.m_data = "id_toc";
  latin1_00.m_size = 6;
  QString::QString((QString *)&preview,latin1_00);
  KDReports::TextElement::setId((QString *)&tocElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&tocElement,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  _preview = 0;
  KDReports::Report::setTabPositions((QList *)&report);
  QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer
            ((QArrayDataPointer<QTextOption::Tab> *)&preview);
  KDReports::TableElement::TableElement(&largeTableElement);
  KDReports::TableElement::setHeaderRowCount((int)&largeTableElement);
  KDReports::TableElement::setHeaderColumnCount((int)&largeTableElement);
  KDReports::AbstractTableElement::setPadding(3.0);
  local_b8.d._0_4_ = 1;
  local_b8.d._4_4_ = 0xdadaffff;
  local_b8.ptr._0_4_ = 0xdadadada;
  local_b8.ptr._4_2_ = 0;
  for (iVar3 = 1; iVar3 != 8; iVar3 = iVar3 + 1) {
    pQVar2 = (QBrush *)KDReports::TableElement::cell((int)&largeTableElement,0);
    QBrush::QBrush((QBrush *)&preview,&local_b8,1);
    KDReports::Element::setBackground(pQVar2);
    QBrush::~QBrush((QBrush *)&preview);
    QString::QString((QString *)&tocText.d,"Column %1");
    QString::arg((QString *)&tocList,(QString *)&tocText.d,iVar3,0,10,(QChar)0x20);
    KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&tocList);
    KDReports::Cell::addElement((Element *)pQVar2,AVar5);
    KDReports::TextElement::~TextElement((TextElement *)&preview);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tocList);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  }
  for (iVar3 = 1; iVar3 != 300; iVar3 = iVar3 + 1) {
    pQVar2 = (QBrush *)KDReports::TableElement::cell((int)&largeTableElement,iVar3);
    QBrush::QBrush((QBrush *)&preview,&local_b8,1);
    KDReports::Element::setBackground(pQVar2);
    QBrush::~QBrush((QBrush *)&preview);
    QString::QString((QString *)&tocText.d,"Row %1");
    QString::arg((QString *)&tocList,(QString *)&tocText.d,iVar3,0,10,(QChar)0x20);
    KDReports::TextElement::TextElement((TextElement *)&preview,(QString *)&tocList);
    KDReports::Cell::addElement((Element *)pQVar2,AVar5);
    KDReports::TextElement::~TextElement((TextElement *)&preview);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tocList);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  }
  for (iVar3 = 1; iVar3 != 8; iVar3 = iVar3 + 1) {
    iVar6 = iVar3;
    for (iVar4 = 1; iVar4 != 300; iVar4 = iVar4 + 1) {
      QString::number(AVar5,iVar6);
      pEVar1 = (Element *)KDReports::TableElement::cell((int)&largeTableElement,iVar4);
      KDReports::TextElement::TextElement((TextElement *)&tocList,(QString *)&preview);
      KDReports::Cell::addElement(pEVar1,(AlignmentFlag)(TextElement *)&tocList);
      KDReports::TextElement::~TextElement((TextElement *)&tocList);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
      iVar6 = iVar6 + 8;
    }
  }
  _preview = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&largeTableElement,(QColor *)0x1);
  latin1_01.m_data = "id_page_count";
  latin1_01.m_size = 0xd;
  QString::QString((QString *)&preview,latin1_01);
  QString::number((int)&tocList,500);
  KDReports::Report::associateTextValue((QString *)&report,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tocList);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  tocList.d.size = 0;
  _preview = 0;
  tocList.d.d = (Data *)0x0;
  tocList.d.ptr = (QString *)0x0;
  tocText.d.d = (Data *)0x0;
  tocText.d.ptr = (char16_t *)0x0;
  tocText.d.size = 0;
  QList<QString>::emplaceBack<QString>(&tocList,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  _preview = 0;
  tocText.d.d = (Data *)0x0;
  tocText.d.ptr = (char16_t *)0x0;
  tocText.d.size = 0;
  QList<QString>::emplaceBack<QString>(&tocList,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  _preview = 0;
  tocText.d.d = (Data *)0x0;
  tocText.d.ptr = (char16_t *)0x0;
  tocText.d.size = 0;
  QList<QString>::emplaceBack<QString>(&tocList,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  _preview = 0;
  local_b8.d._0_4_ = 0;
  local_b8.d._4_4_ = 0;
  local_b8.ptr._0_4_ = 0;
  local_b8.ptr._4_2_ = 0;
  local_b8.ptr._6_2_ = 0;
  local_b8.size = 0;
  QListSpecialMethods<QString>::join
            (&tocText,(QListSpecialMethods<QString> *)&tocList,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  latin1_02.m_data = "id_toc";
  latin1_02.m_size = 6;
  QString::QString((QString *)&preview,latin1_02);
  KDReports::Report::associateTextValue((QString *)&report,(QString *)&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&preview);
  KDReports::PreviewDialog::PreviewDialog(&preview,&report,(QWidget *)0x0);
  iVar3 = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog(&preview);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&tocText.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&tocList.d);
  KDReports::TableElement::~TableElement(&largeTableElement);
  KDReports::TextElement::~TextElement(&tocElement);
  QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs.d);
  KDReports::TextElement::~TextElement(&pageCountElement);
  KDReports::Report::~Report(&report);
  QApplication::~QApplication(&app);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDReports::Report report;
    report.setDefaultFont(QFont("Arial", 8));

    report.setFirstPageNumber(100);

    KDReports::Header &header = report.header(KDReports::FirstPage);
    header.addElement(KDReports::TextElement("This is a test for generating one section of a larger report."));

    KDReports::Footer &footer = report.footer();
    footer.addElement(KDReports::TextElement("We are generating pages 100-109 out of 500."));
    footer.addElement(KDReports::TextElement("Page"), Qt::AlignRight);
    footer.addInlineElement(KDReports::TextElement(" "));
    footer.addVariable(KDReports::PageNumber);
    footer.addInlineElement(KDReports::TextElement(" / "));
    // As an example for combining reports together, we'll set the value of
    // the total page count later, when it's known.
    KDReports::TextElement pageCountElement;
    pageCountElement.setId(QLatin1String("id_page_count"));
    footer.addInlineElement(pageCountElement);

    QList<QTextOption::Tab> tabs;
    tabs.append(KDReports::Report::rightAlignedTab());
    report.setTabPositions(tabs);

    KDReports::TextElement tocElement("<Table of Contents will go here>");
    tocElement.setId(QLatin1String("id_toc"));
    report.addElement(tocElement);

    report.addVerticalSpacing(10);

    report.setTabPositions(QList<QTextOption::Tab>()); // for performance

    KDReports::TableElement largeTableElement = largeTable();
    report.addElement(largeTableElement);

    // Let's assume we know the total page count is 1000 now, let's set it.
    report.associateTextValue(QLatin1String("id_page_count"), QString::number(500));

    // Fill in the table of contents
    QStringList tocList;
    tocList << QStringLiteral("Chapter one\tpage 1");
    tocList << QStringLiteral("Chapter two\tpage 3");
    tocList << QStringLiteral("Last chapter\tpage 6");
    QString tocText = tocList.join(QStringLiteral("\n"));
    report.associateTextValue(QLatin1String("id_toc"), tocText);

    KDReports::PreviewDialog preview(&report);
    return preview.exec();

    // For performance testing...
    // report.exportToFile( "testout.pdf" );
    // return 0;
}